

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

void __thiscall QHttpNetworkReply::ignoreSslErrors(QHttpNetworkReply *this)

{
  long lVar1;
  
  lVar1 = *(long *)(this + 8);
  if (((*(long *)(lVar1 + 0x168) != 0) && (*(int *)(*(long *)(lVar1 + 0x168) + 4) != 0)) &&
     (*(long *)(lVar1 + 0x170) != 0)) {
    QHttpNetworkConnection::ignoreSslErrors(*(QHttpNetworkConnection **)(lVar1 + 0x170),-1);
    return;
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }